

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gulcalc.cpp
# Opt level: O1

void __thiscall gulcalc::outputmode1data(gulcalc *this,int event_id)

{
  pointer *ppgVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  rd_option rVar5;
  iterator iVar6;
  pointer ppVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  pointer pvVar13;
  undefined8 extraout_RAX;
  long lVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  getRands *pgVar18;
  int *piVar19;
  ulong uVar20;
  undefined4 uVar21;
  float fVar22;
  undefined4 uVar23;
  OASIS_FLOAT rval;
  float fVar24;
  float fVar25;
  gulItemIDLoss gi;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  gilv0;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  gilv;
  probrec p;
  OASIS_FLOAT local_12c;
  gulItemIDLoss local_128;
  undefined1 local_118 [16];
  int local_104;
  ulong local_100;
  int *local_f8;
  ulong local_f0;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  local_e8;
  vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
  local_c8;
  probrec local_a4;
  long local_98;
  double local_90;
  ulong local_88;
  pointer local_80;
  pointer local_78;
  long local_70;
  long local_68;
  ulong local_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_f8 = (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (local_f8 !=
      (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_68 = (long)(int)this->rnd_->buffersize_;
    local_70 = (long)event_id;
    local_98 = (local_70 * 0x73d3fc6f) % 0x80000000;
    do {
      local_c8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_c8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_c8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8.
      super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      std::
      vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ::resize(&local_c8,(long)(this->samplesize_ + 1 + this->num_idx_));
      if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
        std::
        vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
        ::resize(&local_e8,(long)(this->num_idx_ + this->samplesize_ + 1));
      }
      iVar3 = *local_f8;
      pvVar13 = (this->mode1_stats_).
                super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_78 = pvVar13[iVar3].super__Vector_base<processrecData,_std::allocator<processrecData>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_80 = *(pointer *)
                  ((long)&pvVar13[iVar3].
                          super__Vector_base<processrecData,_std::allocator<processrecData>_>.
                          _M_impl.super__Vector_impl_data + 8);
      if ((long)local_80 - (long)local_78 == 0) {
        local_12c = 0.0;
        local_90 = 0.0;
      }
      else {
        local_12c = (this->coverages_->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                    super__Vector_impl_data._M_start[iVar3];
        local_90 = (double)(local_12c /
                           (float)(ulong)(((long)local_80 - (long)local_78 >> 4) *
                                         -0x5555555555555555));
      }
      pvVar13 = (this->mode1_stats_).
                super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar13[iVar3].
                   super__Vector_base<processrecData,_std::allocator<processrecData>_>._M_impl.
                   super__Vector_impl_data + 8) !=
          pvVar13[iVar3].super__Vector_base<processrecData,_std::allocator<processrecData>_>._M_impl
          .super__Vector_impl_data._M_start) {
        pvVar13 = pvVar13 + iVar3;
        uVar20 = 0;
        do {
          lVar14 = *(long *)&(pvVar13->
                             super__Vector_base<processrecData,_std::allocator<processrecData>_>).
                             _M_impl.super__Vector_impl_data;
          lVar16 = uVar20 * 0x30;
          local_128.item_id = *(int *)(lVar14 + 0xc + lVar16);
          local_128.loss = (double)*(float *)(lVar14 + 8 + lVar16);
          iVar4 = this->num_idx_;
          iVar6._M_current =
               local_c8.
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -5].
               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
               super__Vector_impl_data._M_finish;
          local_60 = uVar20;
          if (iVar6._M_current ==
              local_c8.
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -5].
              super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
            _M_realloc_insert<gulItemIDLoss_const&>
                      ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                       (local_c8.
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)iVar4 + -5),iVar6,
                       &local_128);
          }
          else {
            *(ulong *)iVar6._M_current = CONCAT44(local_128._4_4_,local_128.item_id);
            (iVar6._M_current)->loss = local_128.loss;
            ppgVar1 = &local_c8.
                       super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -5].
                       super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppgVar1 = *ppgVar1 + 1;
          }
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            iVar4 = this->num_idx_;
            iVar6._M_current =
                 local_e8.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -5].
                 super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                local_e8.
                super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -5].
                super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
              _M_realloc_insert<gulItemIDLoss_const&>
                        ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                         (local_e8.
                          super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar4 + -5),iVar6,
                         &local_128);
            }
            else {
              *(ulong *)iVar6._M_current = CONCAT44(local_128._4_4_,local_128.item_id);
              (iVar6._M_current)->loss = local_128.loss;
              ppgVar1 = &local_e8.
                         super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -5].
                         super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppgVar1 = *ppgVar1 + 1;
            }
          }
          local_128.loss = local_90;
          iVar4 = this->num_idx_;
          iVar6._M_current =
               local_c8.
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -3].
               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              local_c8.
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -3].
              super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
            _M_realloc_insert<gulItemIDLoss_const&>
                      ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                       (local_c8.
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)iVar4 + -3),iVar6,
                       &local_128);
          }
          else {
            *(ulong *)iVar6._M_current = CONCAT44(local_128._4_4_,local_128.item_id);
            (iVar6._M_current)->loss = local_90;
            ppgVar1 = &local_c8.
                       super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -3].
                       super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppgVar1 = *ppgVar1 + 1;
          }
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            iVar4 = this->num_idx_;
            iVar6._M_current =
                 local_e8.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -3].
                 super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                local_e8.
                super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -3].
                super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
              _M_realloc_insert<gulItemIDLoss_const&>
                        ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                         (local_e8.
                          super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar4 + -3),iVar6,
                         &local_128);
            }
            else {
              *(ulong *)iVar6._M_current = CONCAT44(local_128._4_4_,local_128.item_id);
              (iVar6._M_current)->loss = local_128.loss;
              ppgVar1 = &local_e8.
                         super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -3].
                         super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppgVar1 = *ppgVar1 + 1;
            }
          }
          local_128.loss =
               (double)*(float *)(*(long *)&(this->mode1_stats_).
                                            super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                            super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                            ._M_impl.super__Vector_impl_data + 4 + lVar16);
          iVar4 = this->num_idx_;
          iVar6._M_current =
               local_c8.
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -2].
               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              local_c8.
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -2].
              super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
            _M_realloc_insert<gulItemIDLoss_const&>
                      ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                       (local_c8.
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)iVar4 + -2),iVar6,
                       &local_128);
          }
          else {
            *(ulong *)iVar6._M_current = CONCAT44(local_128._4_4_,local_128.item_id);
            (iVar6._M_current)->loss = local_128.loss;
            ppgVar1 = &local_c8.
                       super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -2].
                       super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppgVar1 = *ppgVar1 + 1;
          }
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            iVar4 = this->num_idx_;
            iVar6._M_current =
                 local_e8.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -2].
                 super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                local_e8.
                super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -2].
                super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
              _M_realloc_insert<gulItemIDLoss_const&>
                        ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                         (local_e8.
                          super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar4 + -2),iVar6,
                         &local_128);
            }
            else {
              *(ulong *)iVar6._M_current = CONCAT44(local_128._4_4_,local_128.item_id);
              (iVar6._M_current)->loss = local_128.loss;
              ppgVar1 = &local_e8.
                         super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -2].
                         super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppgVar1 = *ppgVar1 + 1;
            }
          }
          local_128.loss =
               (double)*(float *)(*(long *)&(this->mode1_stats_).
                                            super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                            super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                            ._M_impl.super__Vector_impl_data + lVar16);
          iVar4 = this->num_idx_;
          iVar6._M_current =
               local_c8.
               super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -1].
               super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar6._M_current ==
              local_c8.
              super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -1].
              super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
            _M_realloc_insert<gulItemIDLoss_const&>
                      ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                       (local_c8.
                        super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + (long)iVar4 + -1),iVar6,
                       &local_128);
          }
          else {
            *(ulong *)iVar6._M_current = CONCAT44(local_128._4_4_,local_128.item_id);
            (iVar6._M_current)->loss = local_128.loss;
            ppgVar1 = &local_c8.
                       super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -1].
                       super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                       super__Vector_impl_data._M_finish;
            *ppgVar1 = *ppgVar1 + 1;
          }
          if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
            iVar4 = this->num_idx_;
            iVar6._M_current =
                 local_e8.
                 super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -1].
                 super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar6._M_current ==
                local_e8.
                super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -1].
                super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<gulItemIDLoss,std::allocator<gulItemIDLoss>>::
              _M_realloc_insert<gulItemIDLoss_const&>
                        ((vector<gulItemIDLoss,std::allocator<gulItemIDLoss>> *)
                         (local_e8.
                          super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar4 + -1),iVar6,
                         &local_128);
            }
            else {
              *(ulong *)iVar6._M_current = CONCAT44(local_128._4_4_,local_128.item_id);
              (iVar6._M_current)->loss = local_128.loss;
              ppgVar1 = &local_e8.
                         super__Vector_base<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[(long)iVar4 + -1].
                         super__Vector_base<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>._M_impl.
                         super__Vector_impl_data._M_finish;
              *ppgVar1 = *ppgVar1 + 1;
            }
          }
          rVar5 = this->rndopt_;
          if (rVar5 == usecachedvector) {
            local_100 = (ulong)(uint)this->samplesize_;
            local_f0 = (ulong)(uint)(*(int *)(*(long *)&(this->mode1_stats_).
                                                                                                                
                                                  super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                                  super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                                  ._M_impl.super__Vector_impl_data + 0x10 + lVar16)
                                    * this->samplesize_);
          }
          else if (rVar5 == usehashedseed) {
            iVar4 = this->rand_seed_;
            pgVar18 = this->rnd_;
            uVar20 = (ulong)(*(int *)(*(long *)&(this->mode1_stats_).
                                                super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                                super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                                ._M_impl.super__Vector_impl_data + 0x10 + lVar16) *
                             0x5bfc6fdb + (int)local_98 + iVar4 & 0x7fffffff);
            (pgVar18->gen_)._M_x[0] = uVar20;
            lVar14 = 4;
            do {
              uVar20 = (ulong)((((uint)(uVar20 >> 0x1e) ^ (uint)uVar20) * 0x6c078965 + (int)lVar14)
                              - 3);
              (pgVar18->gen_)._M_x[lVar14 + -3] = uVar20;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0x273);
            (pgVar18->gen_)._M_p = 0x270;
            local_f0 = 0;
            if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
              pgVar18 = this->rnd0_;
              uVar20 = (ulong)(iVar4 + (int)local_98 & 0x7fffffff);
              (pgVar18->gen_)._M_x[0] = uVar20;
              lVar14 = 4;
              do {
                uVar20 = (ulong)((((uint)(uVar20 >> 0x1e) ^ (uint)uVar20) * 0x6c078965 + (int)lVar14
                                 ) - 3);
                (pgVar18->gen_)._M_x[lVar14 + -3] = uVar20;
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x273);
              (pgVar18->gen_)._M_p = 0x270;
            }
            local_100 = 0;
          }
          else {
            if (rVar5 != userandomnumberfile) {
              outputmode1data();
              std::
              vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ::~vector(&local_e8);
              std::
              vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
              ::~vector(&local_c8);
              _Unwind_Resume(extraout_RAX);
            }
            lVar15 = this->p3_ * this->p1_;
            lVar14 = this->p2_ * local_70;
            local_f0 = (*(int *)(*(long *)&(this->mode1_stats_).
                                           super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                           super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                           ._M_impl.super__Vector_impl_data + 0x10 + lVar16) *
                        lVar15 + lVar14) % local_68;
            local_100 = (lVar14 + lVar15) % local_68;
          }
          if (0 < this->samplesize_) {
            uVar20 = 0;
            do {
              pgVar18 = this->rnd_;
              local_88 = uVar20;
              if (this->rndopt_ == usehashedseed) {
                dVar8 = std::
                        generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                  (&pgVar18->gen_);
                dVar2 = (pgVar18->dis_)._M_param._M_a;
                fVar25 = (float)(dVar8 * ((pgVar18->dis_)._M_param._M_b - dVar2) + dVar2);
                if (this->correlatedWriter_ == (_func_void_void_ptr_int_int *)0x0) {
                  rval = 0.0;
                }
                else {
                  local_118 = ZEXT416((uint)fVar25);
                  pgVar18 = this->rnd0_;
                  dVar2 = std::
                          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                    (&pgVar18->gen_);
                  uVar21 = SUB84(dVar2,0);
                  uVar23 = (undefined4)((ulong)dVar2 >> 0x20);
LAB_00103ef3:
                  dVar2 = (pgVar18->dis_)._M_param._M_a;
                  rval = (OASIS_FLOAT)
                         ((double)CONCAT44(uVar23,uVar21) * ((pgVar18->dis_)._M_param._M_b - dVar2)
                         + dVar2);
LAB_00103f18:
                  fVar25 = (float)local_118._0_4_;
                }
              }
              else {
                uVar17 = (int)uVar20 + (int)local_f0;
                rVar5 = pgVar18->rndopt_;
                if (rVar5 == usecachedvector) {
                  fVar25 = (pgVar18->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_start
                           [(ulong)uVar17 % (ulong)(uint)pgVar18->rand_vec_size_];
                  if (fVar25 < 0.0) {
                    dVar8 = std::
                            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                      (&pgVar18->gen_);
                    dVar2 = (pgVar18->dis_)._M_param._M_a;
                    fVar25 = (float)(dVar8 * ((pgVar18->dis_)._M_param._M_b - dVar2) + dVar2);
                    (pgVar18->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start
                    [(ulong)uVar17 % (ulong)(uint)pgVar18->rand_vec_size_] = fVar25;
                  }
                }
                else if (rVar5 == usehashedseed) {
                  dVar8 = std::
                          generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                    (&pgVar18->gen_);
                  dVar2 = (pgVar18->dis_)._M_param._M_a;
                  fVar25 = (float)(dVar8 * ((pgVar18->dis_)._M_param._M_b - dVar2) + dVar2);
                }
                else if (rVar5 == userandomnumberfile) {
                  uVar12 = pgVar18->buffersize_;
                  if (uVar17 < uVar12) {
                    uVar12 = 0;
                  }
                  fVar25 = pgVar18->buf_[uVar17 - uVar12];
                }
                else {
                  fprintf(_stderr,"Invalid rndopt_: %d");
                  fVar25 = 0.0;
                }
                rval = 0.0;
                if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
                  pgVar18 = this->rnd0_;
                  uVar17 = (int)uVar20 + (int)local_100;
                  rVar5 = pgVar18->rndopt_;
                  if (rVar5 == usecachedvector) {
                    rval = (pgVar18->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_start
                           [(ulong)uVar17 % (ulong)(uint)pgVar18->rand_vec_size_];
                    if (rval < 0.0) {
                      local_118 = ZEXT416((uint)fVar25);
                      dVar8 = std::
                              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                        (&pgVar18->gen_);
                      dVar2 = (pgVar18->dis_)._M_param._M_a;
                      rval = (OASIS_FLOAT)(dVar8 * ((pgVar18->dis_)._M_param._M_b - dVar2) + dVar2);
                      (pgVar18->rnd_).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [(ulong)uVar17 % (ulong)(uint)pgVar18->rand_vec_size_] = rval;
                      goto LAB_00103f18;
                    }
                  }
                  else {
                    if (rVar5 == usehashedseed) {
                      local_118 = ZEXT416((uint)fVar25);
                      dVar2 = std::
                              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                        (&pgVar18->gen_);
                      uVar21 = SUB84(dVar2,0);
                      uVar23 = (undefined4)((ulong)dVar2 >> 0x20);
                      goto LAB_00103ef3;
                    }
                    if (rVar5 == userandomnumberfile) {
                      uVar12 = pgVar18->buffersize_;
                      if (uVar17 < uVar12) {
                        uVar12 = 0;
                      }
                      rval = pgVar18->buf_[uVar17 - uVar12];
                    }
                    else {
                      local_118 = ZEXT416((uint)fVar25);
                      fprintf(_stderr,"Invalid rndopt_: %d");
                      rval = 0.0;
                      fVar25 = (float)local_118._0_4_;
                    }
                  }
                }
              }
              lVar14 = *(long *)&(this->mode1_stats_).
                                 super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                 super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                 ._M_impl.super__Vector_impl_data;
              lVar15 = *(long *)(lVar14 + 0x20 + lVar16);
              fVar24 = (this->bin_lookup_).super__Vector_base<prob_mean,_std::allocator<prob_mean>_>
                       ._M_impl.super__Vector_impl_data._M_start[*(int *)(lVar15 + -4)].prob_to;
              uVar23 = (undefined4)((ulong)((double)fVar24 + -3e-08) >> 0x20);
              fVar22 = (float)((double)fVar24 + -3e-08);
              uVar21 = 0;
              if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) {
                rval = (OASIS_FLOAT)
                       (-(uint)(rval < fVar24) & (uint)rval | ~-(uint)(rval < fVar24) & (uint)fVar22
                       );
                uVar21 = uVar23;
              }
              uVar17 = (uint)((ulong)(lVar15 - *(long *)(lVar14 + 0x18 + lVar16)) >> 2);
              if (0 < (int)uVar17) {
                fVar25 = (float)(-(uint)(fVar25 < fVar24) & (uint)fVar25 |
                                ~-(uint)(fVar25 < fVar24) & (uint)fVar22);
                local_104 = (int)local_88 + 1;
                fVar24 = 0.0;
                uVar20 = 0;
                bVar11 = false;
                bVar10 = false;
                local_48 = CONCAT44(uVar21,rval);
                uStack_40 = 0;
                uStack_50 = 0;
                uStack_4c = 0;
                local_58 = fVar25;
                uStack_54 = uVar23;
                do {
                  ppVar7 = (this->bin_lookup_).
                           super__Vector_base<prob_mean,_std::allocator<prob_mean>_>._M_impl.
                           super__Vector_impl_data._M_start;
                  iVar4 = *(int *)(*(long *)(*(long *)&(this->mode1_stats_).
                                                                                                              
                                                  super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[iVar3].
                                                  super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                                  ._M_impl.super__Vector_impl_data + 0x18 + lVar16)
                                  + uVar20 * 4);
                  fVar22 = ppVar7[iVar4].prob_to;
                  local_a4.bin_mean = ppVar7[iVar4].bin_mean;
                  local_a4.prob_from = fVar24;
                  local_a4.prob_to = fVar22;
                  bVar9 = bVar10;
                  if ((fVar22 <= fVar25) || (bVar10)) {
LAB_00104023:
                    if (((this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0) &&
                        (rval < fVar22)) && (!bVar11)) {
                      bVar11 = true;
                      local_118._0_4_ = fVar22;
                      fillgulitemloss(this,local_128.item_id,local_12c,event_id,(int)uVar20,rval,
                                      &local_a4,local_104,&local_e8);
                      rval = (float)local_48;
                      fVar22 = (float)local_118._0_4_;
                      fVar25 = local_58;
                    }
                    fVar24 = fVar22;
                    bVar10 = bVar9;
                    if ((bVar9) && (bVar11)) {
                      bVar9 = false;
                    }
                    else {
                      bVar9 = true;
                    }
                  }
                  else {
                    local_118._0_4_ = fVar22;
                    fillgulitemloss(this,local_128.item_id,local_12c,event_id,(int)uVar20,fVar25,
                                    &local_a4,local_104,&local_c8);
                    rval = (float)local_48;
                    fVar22 = (float)local_118._0_4_;
                    fVar25 = local_58;
                    bVar9 = true;
                    if (this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0)
                    goto LAB_00104023;
                    bVar9 = false;
                    fVar24 = (float)local_118._0_4_;
                  }
                } while ((bVar9) && (uVar20 = uVar20 + 1, uVar20 < (uVar17 & 0x7fffffff)));
              }
              uVar17 = (int)local_88 + 1;
              uVar20 = (ulong)uVar17;
            } while ((int)uVar17 < this->samplesize_);
          }
          pvVar13 = (this->mode1_stats_).
                    super__Vector_base<std::vector<processrecData,_std::allocator<processrecData>_>,_std::allocator<std::vector<processrecData,_std::allocator<processrecData>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + iVar3;
          uVar20 = local_60 + 1;
        } while (uVar20 < (ulong)(((long)*(pointer *)
                                          ((long)&(pvVar13->
                                                  super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                                  )._M_impl.super__Vector_impl_data + 8) -
                                   *(long *)&(pvVar13->
                                             super__Vector_base<processrecData,_std::allocator<processrecData>_>
                                             )._M_impl.super__Vector_impl_data >> 4) *
                                 -0x5555555555555555));
      }
      if ((local_80 != local_78) &&
         (writemode1output(this,event_id,local_12c,&local_c8,false),
         this->correlatedWriter_ != (_func_void_void_ptr_int_int *)0x0)) {
        writemode1output(this,event_id,local_12c,&local_e8,true);
      }
      piVar19 = local_f8 + 1;
      std::
      vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ::~vector(&local_e8);
      std::
      vector<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>,_std::allocator<std::vector<gulItemIDLoss,_std::allocator<gulItemIDLoss>_>_>_>
      ::~vector(&local_c8);
      local_f8 = piVar19;
    } while (piVar19 !=
             (this->mode1UsedCoverageIDs_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  clearmode1_data(this);
  return;
}

Assistant:

void gulcalc::outputmode1data(int event_id) {

	int rnd_count = rnd_->rdxmax();

	auto cov_iter = mode1UsedCoverageIDs_.begin();
	while (cov_iter != mode1UsedCoverageIDs_.end()) {

		std::vector<std::vector<gulItemIDLoss>> gilv;
		std::vector<std::vector<gulItemIDLoss>> gilv0;
		gilv.resize(samplesize_ + num_idx_ + 1);
		if (correlatedWriter_) gilv0.resize(samplesize_ + num_idx_ + 1);
		int j = *cov_iter;
		OASIS_FLOAT tiv = 0.0;
		OASIS_FLOAT exposureValue = 0.0;
		bool hasData = false;
		if (mode1_stats_[j].size() > 0) {
			tiv = (*coverages_)[j];
			exposureValue = tiv / mode1_stats_[j].size();
			hasData = true;
		}

		for (size_t i = 0; i < mode1_stats_[j].size(); i++) {

			gulItemIDLoss gi;
			gi.item_id = mode1_stats_[j][i].item_id;

			// maximum loss
			gi.loss = mode1_stats_[j][i].max_loss;
			gilv[max_loss_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[max_loss_idx + num_idx_].push_back(gi);

			// exposure value record
			// tiv / count(tuple(event_id-coverage_id))
			gi.loss = exposureValue;
			gilv[tiv_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[tiv_idx + num_idx_].push_back(gi);

			// standard deviation
			gi.loss = mode1_stats_[j][i].std_dev;
			gilv[std_dev_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[std_dev_idx + num_idx_].push_back(gi);

			// mean
			gi.loss = mode1_stats_[j][i].gul_mean;
			gilv[mean_idx + num_idx_].push_back(gi);
			if (correlatedWriter_)
				gilv0[mean_idx + num_idx_].push_back(gi);

			int ridx = 0;
			int ridx0 = 0;
			switch (rndopt_) {
				case rd_option::userandomnumberfile:
					ridx = ((mode1_stats_[j][i].group_id * p1_ * p3_) + (event_id * p2_)) % rnd_count;
					ridx0 = ((p1_ * p3_) + (event_id * p2_)) % rnd_count;
					break;
				case rd_option::usecachedvector:
					ridx = mode1_stats_[j][i].group_id * samplesize_;
					ridx0 = samplesize_;
					break;
				case rd_option::usehashedseed:
				{
					unsigned long long s1 = (mode1_stats_[j][i].group_id * 1543270363L) % 2147483648L;   // hash group_id and event_id to seed random number
					unsigned long long s2 = (event_id * 1943272559L) % 2147483648L;
					s1 = (s1 + s2 + rand_seed_) % 2147483648L;
					rnd_->seedRands(s1);
					if (correlatedWriter_) {
						s2 = (s2 + rand_seed_) % 2147483648L;
						rnd0_->seedRands(s2);
					}
				}
				break;
				default:
					fprintf(stderr, "FATAL: %s: Unknown random number option\n", __func__);
					exit(-1);
			}

			// Generate losses for each sample
			for (int k = 0; k < samplesize_; k++) {

				OASIS_FLOAT rval;
				OASIS_FLOAT rval0 = 0;

				if (rndopt_ == rd_option::usehashedseed) {
					rval = rnd_->nextrnd();
					if (correlatedWriter_) rval0 = rnd0_->nextrnd();
				} else {
					rval = rnd_->rnd(ridx + k);
					if (correlatedWriter_) rval0 = rnd0_->rnd(ridx0 + k);
				}

				// If required set random number to just under
				// maximum prob_to (which should be 1)
				OASIS_FLOAT prob_to_max = bin_lookup_[mode1_stats_[j][i].bin_map_ids.back()].prob_to;
				if (rval >= prob_to_max) {
					rval = prob_to_max - 0.00000003;
				}
				if (correlatedWriter_ && rval0 >= prob_to_max) {
					rval0 = prob_to_max - 0.00000003;
				}

				OASIS_FLOAT last_prob_to = 0;
				bool hit_rval = false;
				bool hit_rval0 = false;
				int max_bin_end = (int)mode1_stats_[j][i].bin_map_ids.size();
				for (int bin_index = 0; bin_index < max_bin_end; bin_index++) {

					prob_mean pp = bin_lookup_[mode1_stats_[j][i].bin_map_ids[bin_index]];
					probrec p;
					p.prob_from = last_prob_to;
					p.prob_to = pp.prob_to;
					p.bin_mean = pp.bin_mean;
					last_prob_to = pp.prob_to;

					if (rval < p.prob_to && !hit_rval) {
						fillgulitemloss(gi.item_id, tiv, event_id, bin_index, rval, p, k+1, gilv);
						if (!correlatedWriter_) break;
						else hit_rval = true;
					}
					if (correlatedWriter_ && rval0 < p.prob_to && !hit_rval0) {
						fillgulitemloss(gi.item_id, tiv, event_id, bin_index, rval0, p, k+1, gilv0);
						hit_rval0 = true;
					}
					if (hit_rval && hit_rval0) break;

				}

			}

		}

		if (hasData) {

			writemode1output(event_id, tiv, gilv);
			if (correlatedWriter_) {
				writemode1output(event_id, tiv, gilv0, true);
			}

		}

		cov_iter++;

	}

	clearmode1_data();

}